

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix4f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *result)

{
  pointer pmVar1;
  StreamReader *pSVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  allocator *paVar6;
  char *pcVar7;
  string *msg;
  allocator local_95;
  undefined4 local_94;
  char c;
  matrix4f value;
  
  pmVar1 = (result->
           super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>).
      _M_impl.super__Vector_impl_data._M_finish != pmVar1) {
    (result->
    super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>).
    _M_impl.super__Vector_impl_data._M_finish = pmVar1;
  }
  bVar3 = SkipWhitespaceAndNewline(this,true);
  if (bVar3) {
    value.m[0][0] = 1.0;
    value.m[0][1] = 0.0;
    value.m[0][2] = 0.0;
    value.m[0][3] = 0.0;
    value.m[1][0] = 0.0;
    value.m[1][1] = 1.0;
    value.m[1][2] = 0.0;
    value.m[1][3] = 0.0;
    value.m[2][0] = 0.0;
    value.m[2][1] = 0.0;
    value.m[2][2] = 1.0;
    value.m[2][3] = 0.0;
    value.m[3][0] = 0.0;
    value.m[3][1] = 0.0;
    value.m[3][2] = 0.0;
    value.m[3][3] = 1.0;
    bVar3 = ParseMatrix(this,&value);
    if (bVar3) {
      local_94 = (undefined4)CONCAT71(in_register_00000011,end_symbol);
      ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
      push_back(result,&value);
      do {
        bVar3 = Eof(this);
        if (bVar3) goto LAB_002c4714;
        bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = Char1(this,&c);
        if (!bVar3) {
          return false;
        }
        if (c == sep) {
          bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          bVar3 = LookChar1(this,(char *)&value);
          if (!bVar3) {
            return false;
          }
          iVar4 = 3;
          if (value.m[0][0]._0_1_ != (char)local_94) goto LAB_002c4653;
        }
        else {
LAB_002c4653:
          if (c != sep) {
            pSVar2 = this->_sr;
            if ((0 < (long)pSVar2->idx_) && (uVar5 = pSVar2->idx_ - 1, uVar5 <= pSVar2->length_)) {
              pSVar2->idx_ = uVar5;
            }
            goto LAB_002c4714;
          }
          bVar3 = SkipWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          value.m[0][0] = 1.0;
          value.m[0][1] = 0.0;
          value.m[0][2] = 0.0;
          value.m[0][3] = 0.0;
          value.m[1][0] = 0.0;
          value.m[1][1] = 1.0;
          value.m[1][2] = 0.0;
          value.m[1][3] = 0.0;
          value.m[2][0] = 0.0;
          value.m[2][1] = 0.0;
          value.m[2][2] = 1.0;
          value.m[2][3] = 0.0;
          value.m[3][0] = 0.0;
          value.m[3][1] = 0.0;
          value.m[3][2] = 0.0;
          value.m[3][3] = 1.0;
          bVar3 = ParseMatrix(this,&value);
          iVar4 = 3;
          if (bVar3) {
            ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
            push_back(result,&value);
            iVar4 = 0;
          }
        }
      } while (iVar4 == 0);
      if (iVar4 == 1) {
        return false;
      }
LAB_002c4714:
      if ((result->
          super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>)
          ._M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>)
          ._M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar7 = "Empty array.\n";
      msg = (string *)&value;
      paVar6 = (allocator *)&c;
    }
    else {
      pcVar7 = "Not starting with the value of requested type.\n";
      msg = (string *)&c;
      paVar6 = &local_95;
    }
    ::std::__cxx11::string::string((string *)msg,pcVar7,paVar6);
    PushError(this,msg);
    ::std::__cxx11::string::_M_dispose();
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}